

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk50(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk50_entry *peVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar6 = (bios->power).unk50.offset;
  iVar1 = -0x16;
  if (uVar6 != 0) {
    bios_u8(bios,uVar6,&(bios->power).unk50.version);
    if ((bios->power).unk50.version == '\x10') {
      iVar1 = bios_u8(bios,(bios->power).unk50.offset + 1,&(bios->power).unk50.hlen);
      iVar2 = bios_u8(bios,(bios->power).unk50.offset + 2,&(bios->power).unk50.rlen);
      iVar3 = bios_u8(bios,(bios->power).unk50.offset + 3,&(bios->power).unk50.entriesnum);
      (bios->power).unk50.valid = iVar3 == 0 && (iVar2 == 0 && iVar1 == 0);
      uVar8 = (ulong)(bios->power).unk50.entriesnum;
      peVar4 = (envy_bios_power_unk50_entry *)malloc(uVar8 * 0x14);
      (bios->power).unk50.entries = peVar4;
      lVar7 = 8;
      for (uVar5 = 0; uVar5 < uVar8; uVar5 = uVar5 + 1) {
        peVar4 = (bios->power).unk50.entries;
        uVar6 = (uint)(bios->power).unk50.rlen * (int)uVar5 +
                (uint)(bios->power).unk50.hlen + (bios->power).unk50.offset;
        *(uint *)((long)peVar4 + lVar7 + -8) = uVar6;
        bios_u8(bios,uVar6,(uint8_t *)((long)peVar4 + lVar7 + -4));
        bios_u16(bios,*(int *)((long)peVar4 + lVar7 + -8) + 2,
                 (uint16_t *)((long)peVar4 + lVar7 + -2));
        bios_u16(bios,*(int *)((long)peVar4 + lVar7 + -8) + 4,
                 (uint16_t *)((long)&peVar4->offset + lVar7));
        bios_u16(bios,*(int *)((long)peVar4 + lVar7 + -8) + 6,
                 (uint16_t *)((long)&peVar4->offset + lVar7 + 2));
        bios_u16(bios,*(int *)((long)peVar4 + lVar7 + -8) + 8,(uint16_t *)(&peVar4->mode + lVar7));
        bios_u16(bios,*(int *)((long)peVar4 + lVar7 + -8) + 0x12,
                 (uint16_t *)((long)&peVar4->t0 + lVar7));
        bios_u16(bios,*(int *)((long)peVar4 + lVar7 + -8) + 0x14,
                 (uint16_t *)((long)&peVar4->t1 + lVar7));
        uVar8 = (ulong)(bios->power).unk50.entriesnum;
        lVar7 = lVar7 + 0x14;
      }
      iVar1 = 0;
    }
    else {
      fprintf(_stderr,"Unknown THERMAL POLICY table version 0x%x\n");
    }
  }
  return iVar1;
}

Assistant:

int envy_bios_parse_power_unk50(struct envy_bios *bios) {
	struct envy_bios_power_unk50 *unk50 = &bios->power.unk50;
	int i, err = 0;

	if (!unk50->offset)
		return -EINVAL;

	bios_u8(bios, unk50->offset + 0x0, &unk50->version);
	switch(unk50->version) {
	case 0x10:
		err |= bios_u8(bios, unk50->offset + 0x1, &unk50->hlen);
		err |= bios_u8(bios, unk50->offset + 0x2, &unk50->rlen);
		err |= bios_u8(bios, unk50->offset + 0x3, &unk50->entriesnum);
		unk50->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL POLICY table version 0x%x\n", unk50->version);
		return -EINVAL;
	};

	err = 0;
	unk50->entries = malloc(unk50->entriesnum * sizeof(struct envy_bios_power_unk50_entry));
	for (i = 0; i < unk50->entriesnum; i++) {
		struct envy_bios_power_unk50_entry *e = &unk50->entries[i];

		e->offset = unk50->offset + unk50->hlen + i * unk50->rlen;
		bios_u8 (bios, e->offset + 0x0, &e->mode);
		bios_u16(bios, e->offset + 0x2, &e->t0);
		bios_u16(bios, e->offset + 0x4, &e->t1);
		bios_u16(bios, e->offset + 0x6, &e->t2);
		bios_u16(bios, e->offset + 0x8, &e->interval_us);

		bios_u16(bios, e->offset + 0x12, &e->down_off);
		bios_u16(bios, e->offset + 0x14, &e->up_off);
	}

	return 0;
}